

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS
ref_node_ratio_log_quadrature(REF_NODE ref_node,REF_INT node0,REF_INT node1,REF_DBL *ratio)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL w [1];
  REF_DBL x [1];
  REF_INT n;
  REF_INT i;
  REF_DBL w1;
  REF_DBL w0;
  REF_INT im;
  REF_DBL direction [3];
  double local_e8;
  REF_DBL m [6];
  REF_DBL mlog [6];
  REF_DBL mlog1 [6];
  REF_DBL mlog0 [6];
  REF_DBL *ratio_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_NODE ref_node_local;
  
  memset(w,0,8);
  _ref_private_macro_code_rss_1 = 0x4000000000000000;
  *ratio = 0.0;
  dVar2 = ref_node->real[node1 * 0xf] - ref_node->real[node0 * 0xf];
  dVar3 = ref_node->real[node1 * 0xf + 1] - ref_node->real[node0 * 0xf + 1];
  dVar4 = ref_node->real[node1 * 0xf + 2] - ref_node->real[node0 * 0xf + 2];
  ref_node_local._4_4_ = ref_node_metric_get_log(ref_node,node0,mlog1 + 5);
  if (ref_node_local._4_4_ == 0) {
    ref_node_local._4_4_ = ref_node_metric_get_log(ref_node,node1,mlog + 5);
    if (ref_node_local._4_4_ == 0) {
      for (x[0]._4_4_ = 0; x[0]._4_4_ < 1; x[0]._4_4_ = x[0]._4_4_ + 1) {
        dVar5 = w[x[0]._4_4_] * 0.5 + 0.5;
        for (w0._4_4_ = 0; w0._4_4_ < 6; w0._4_4_ = w0._4_4_ + 1) {
          m[(long)w0._4_4_ + 5] =
               (1.0 - dVar5) * mlog1[(long)w0._4_4_ + 5] + dVar5 * mlog[(long)w0._4_4_ + 5];
        }
        uVar1 = ref_matrix_exp_m(m + 5,&local_e8);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0x56c,"ref_node_ratio_log_quadrature",(ulong)uVar1,"exp");
          return uVar1;
        }
        dVar5 = *(double *)(&ref_private_macro_code_rss_1 + (long)x[0]._4_4_ * 2);
        dVar6 = sqrt(dVar4 * (m[4] * dVar4 + m[1] * dVar2 + m[3] * dVar3) +
                     dVar2 * (m[1] * dVar4 + local_e8 * dVar2 + m[0] * dVar3) +
                     dVar3 * (m[3] * dVar4 + m[0] * dVar2 + m[2] * dVar3));
        *ratio = dVar5 * 0.5 * dVar6 + *ratio;
      }
      ref_node_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x564,
             "ref_node_ratio_log_quadrature",(ulong)ref_node_local._4_4_,"node1 m");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x563,
           "ref_node_ratio_log_quadrature",(ulong)ref_node_local._4_4_,"node0 m");
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_node_ratio_log_quadrature(REF_NODE ref_node,
                                                        REF_INT node0,
                                                        REF_INT node1,
                                                        REF_DBL *ratio) {
  REF_DBL mlog0[6], mlog1[6];
  REF_DBL mlog[6], m[6];
  REF_DBL direction[3];
  REF_INT im;
  REF_DBL w0, w1;
  REF_INT i;

  /*
  REF_INT n = 3;
  REF_DBL x[] = {-sqrt(3.0 / 5.0), 0.0, sqrt(3.0 / 5.0)};
  REF_DBL w[] = {5.0 / 9.0, 8.0 / 9.0, 5.0 / 9.0};
  */
  REF_INT n = 1;
  REF_DBL x[] = {0.0};
  REF_DBL w[] = {2.0};

  *ratio = 0.0;

  direction[0] =
      (ref_node_xyz(ref_node, 0, node1) - ref_node_xyz(ref_node, 0, node0));
  direction[1] =
      (ref_node_xyz(ref_node, 1, node1) - ref_node_xyz(ref_node, 1, node0));
  direction[2] =
      (ref_node_xyz(ref_node, 2, node1) - ref_node_xyz(ref_node, 2, node0));
  RSS(ref_node_metric_get_log(ref_node, node0, mlog0), "node0 m");
  RSS(ref_node_metric_get_log(ref_node, node1, mlog1), "node1 m");

  for (i = 0; i < n; i++) {
    w1 = 0.5 * x[i] + 0.5;
    w0 = 1.0 - w1;
    for (im = 0; im < 6; im++) {
      mlog[im] = w0 * mlog0[im] + w1 * mlog1[im];
    }
    RSS(ref_matrix_exp_m(mlog, m), "exp");
    *ratio += 0.5 * w[i] * ref_matrix_sqrt_vt_m_v(m, direction);
  }

  return REF_SUCCESS;
}